

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUTF8.cxx
# Opt level: O2

bool is_invalid(char *s)

{
  int iVar1;
  char *__s;
  bool passed;
  
  iVar1 = cm_utf8_is_valid(s);
  passed = iVar1 == 0;
  __s = "expected invalid, reported as valid";
  if (passed) {
    __s = "invalid as expected";
  }
  report_invalid(passed,s);
  puts(__s);
  return passed;
}

Assistant:

static bool is_invalid(const char* s)
{
  bool valid = cm_utf8_is_valid(s) != 0;
  if (valid) {
    report_invalid(false, s);
    printf("expected invalid, reported as valid\n");
    return false;
  }
  report_invalid(true, s);
  printf("invalid as expected\n");
  return true;
}